

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O0

void __thiscall
QGraphicsItemAnimationPrivate::insertUniquePair
          (QGraphicsItemAnimationPrivate *this,qreal step,qreal value,
          QList<QGraphicsItemAnimationPrivate::Pair> *binList,char *method)

{
  bool bVar1;
  iterator before;
  iterator o;
  Pair *pPVar2;
  iterator in_RSI;
  long in_FS_OFFSET;
  iterator in_XMM1_Qa;
  iterator result;
  Pair pair;
  parameter_type in_stack_ffffffffffffff78;
  QList<QGraphicsItemAnimationPrivate::Pair> *in_stack_ffffffffffffff80;
  Pair *in_stack_ffffffffffffff90;
  const_iterator local_28;
  iterator local_20;
  Pair local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = check_step_valid((qreal)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  if (bVar1) {
    local_20.i = (Pair *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QGraphicsItemAnimationPrivate::Pair>::begin(in_stack_ffffffffffffff80);
    before = QList<QGraphicsItemAnimationPrivate::Pair>::end(in_stack_ffffffffffffff80);
    local_20 = std::
               lower_bound<QList<QGraphicsItemAnimationPrivate::Pair>::iterator,QGraphicsItemAnimationPrivate::Pair>
                         (in_XMM1_Qa,in_RSI,in_stack_ffffffffffffff90);
    o = QList<QGraphicsItemAnimationPrivate::Pair>::end(in_stack_ffffffffffffff80);
    bVar1 = QList<QGraphicsItemAnimationPrivate::Pair>::iterator::operator==(&local_20,o);
    if (!bVar1) {
      pPVar2 = QList<QGraphicsItemAnimationPrivate::Pair>::iterator::operator*(&local_20);
      bVar1 = Pair::operator<(&local_18,pPVar2);
      if (!bVar1) {
        pPVar2 = QList<QGraphicsItemAnimationPrivate::Pair>::iterator::operator->(&local_20);
        pPVar2->value = (qreal)in_XMM1_Qa.i;
        goto LAB_00a60e3f;
      }
    }
    QList<QGraphicsItemAnimationPrivate::Pair>::const_iterator::const_iterator(&local_28,local_20);
    QList<QGraphicsItemAnimationPrivate::Pair>::insert
              ((QList<QGraphicsItemAnimationPrivate::Pair> *)in_RSI.i,(const_iterator)before.i,
               in_stack_ffffffffffffff78);
  }
LAB_00a60e3f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemAnimationPrivate::insertUniquePair(qreal step, qreal value, QList<Pair> *binList,
                                                     const char *method)
{
    if (!check_step_valid(step, method))
        return;

    const Pair pair = { step, value };

    const QList<Pair>::iterator result = std::lower_bound(binList->begin(), binList->end(), pair);
    if (result == binList->end() || pair < *result)
        binList->insert(result, pair);
    else
        result->value = value;
}